

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

void __thiscall asmjit::JitAllocator::JitAllocator(JitAllocator *this,CreateParams *params)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  Info IVar4;
  CreateParams *pCVar5;
  undefined1 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  IVar4 = VirtMem::info();
  pCVar5 = (CreateParams *)&JitAllocatorParams_none;
  if (params != (CreateParams *)0x0) {
    pCVar5 = params;
  }
  uVar10 = pCVar5->options;
  uVar1 = pCVar5->blockSize;
  uVar9 = pCVar5->granularity;
  uVar2 = pCVar5->fillPattern;
  lVar11 = (ulong)(uVar10 & 2) + 1;
  uVar12 = uVar9;
  if ((uVar9 & uVar9 - 1) != 0) {
    uVar12 = 0x40;
  }
  if (0xc0 < uVar9 - 0x40) {
    uVar12 = 0x40;
  }
  puVar6 = (undefined1 *)malloc(lVar11 * 0x38 + 0x58);
  if ((Impl *)puVar6 == (Impl *)0x0) {
    puVar6 = JitAllocatorImpl_none;
  }
  else {
    if ((uVar10 >> 0x1c & 1) == 0) {
      uVar2 = 0xcccccccc;
    }
    uVar9 = uVar1;
    if ((uVar1 & uVar1 - 1) != 0) {
      uVar9 = IVar4.pageGranularity;
    }
    if (0xfff0000 < uVar1 - 0x10000) {
      uVar9 = IVar4.pageGranularity;
    }
    ((Impl *)((long)puVar6 + 0x40))->options = 0;
    ((Impl *)((long)puVar6 + 0x40))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x30))->options = 0;
    ((Impl *)((long)puVar6 + 0x30))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x10))->options = 0;
    ((Impl *)((long)puVar6 + 0x10))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x10))->granularity = 0;
    ((Impl *)((long)puVar6 + 0x10))->fillPattern = 0;
    ((Impl *)((long)puVar6 + 0x20))->options = 0;
    ((Impl *)((long)puVar6 + 0x20))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x20))->granularity = 0;
    ((Impl *)((long)puVar6 + 0x20))->fillPattern = 0;
    *(uint32_t **)&((Impl *)((long)puVar6 + 0x40))->granularity =
         &((Impl *)((long)puVar6 + 0x50))->granularity;
    *(long *)((long)puVar6 + 0x50) = lVar11;
    ((Impl *)puVar6)->options = uVar10;
    ((Impl *)puVar6)->blockSize = uVar9;
    ((Impl *)puVar6)->granularity = uVar12;
    ((Impl *)puVar6)->fillPattern = uVar2;
    ((Impl *)((long)puVar6 + 0x30))->granularity = IVar4.pageSize;
    puVar8 = (undefined8 *)((long)&((Impl *)((long)puVar6 + 0x70))->blockSize + 3);
    lVar7 = 0;
    do {
      uVar10 = uVar12 << ((byte)lVar7 & 0x1f);
      *(undefined8 *)((long)puVar8 + -0x13) = 0;
      *(undefined8 *)((long)puVar8 + -0xb) = 0;
      *(undefined8 *)((long)puVar8 + -0x1f) = 0;
      *(undefined8 *)((long)puVar8 + -0x17) = 0;
      *(short *)((long)puVar8 + -3) = (short)uVar10;
      iVar3 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
        }
      }
      *(char *)((long)puVar8 + -1) = (char)iVar3;
      *puVar8 = 0;
      puVar8[1] = 0;
      *(undefined8 *)((long)puVar8 + 9) = 0;
      *(undefined8 *)((long)puVar8 + 0x11) = 0;
      lVar7 = lVar7 + 1;
      puVar8 = puVar8 + 7;
    } while (lVar11 != lVar7);
  }
  this->_impl = (Impl *)puVar6;
  return;
}

Assistant:

JitAllocator::JitAllocator(const CreateParams* params) noexcept {
  _impl = JitAllocatorImpl_new(params);
  if (ASMJIT_UNLIKELY(!_impl))
    _impl = const_cast<JitAllocator::Impl*>(&JitAllocatorImpl_none);
}